

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O3

void __thiscall
glslang::TConstUnionArray::TConstUnionArray
          (TConstUnionArray *this,TConstUnionArray *a,int start,int size)

{
  pointer pTVar1;
  pointer pTVar2;
  TPoolAllocator *this_00;
  vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_> *this_01;
  long lVar3;
  allocator_type local_38;
  
  this->_vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00af64b8;
  this_00 = GetThreadPoolAllocator();
  this_01 = (vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_> *)
            TPoolAllocator::allocate(this_00,0x20);
  local_38.allocator = GetThreadPoolAllocator();
  std::vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>::vector
            (this_01,(long)size,&local_38);
  this->unionArray = (TConstUnionVector *)this_01;
  if (0 < size) {
    lVar3 = 0;
    do {
      pTVar1 = (a->unionArray->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (this->unionArray->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)&pTVar2->type + lVar3) =
           *(undefined4 *)((long)&pTVar1[start].type + lVar3);
      *(undefined8 *)((long)&pTVar2->field_0 + lVar3) =
           *(undefined8 *)((long)&pTVar1[start].field_0 + lVar3);
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)size << 4 != lVar3);
  }
  return;
}

Assistant:

TConstUnionArray(const TConstUnionArray& a, int start, int size)
    {
        unionArray = new TConstUnionVector(size);
        for (int i = 0; i < size; ++i)
            (*unionArray)[i] = a[start + i];
    }